

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utPretransformVertices.cpp
# Opt level: O1

void __thiscall
PretransformVerticesTest_testProcessKeepHierarchy_Test::TestBody
          (PretransformVerticesTest_testProcessKeepHierarchy_Test *this)

{
  PretransformVertices *pPVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  ((this->super_PretransformVerticesTest).mProcess)->configKeepHierarchy = true;
  pPVar1 = (this->super_PretransformVerticesTest).mProcess;
  (*(pPVar1->super_BaseProcess)._vptr_BaseProcess[5])
            (pPVar1,(this->super_PretransformVerticesTest).mScene);
  local_30.ptr_._0_4_ = 5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_20,"5U","mScene->mNumMaterials",(uint *)&local_30,
             &((this->super_PretransformVerticesTest).mScene)->mNumMaterials);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPretransformVertices.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.ptr_._0_4_ = 0x31;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            (local_20,"49U","mScene->mNumMeshes",(uint *)&local_30,
             &((this->super_PretransformVerticesTest).mScene)->mNumMeshes);
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utPretransformVertices.cpp"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(PretransformVerticesTest, testProcessKeepHierarchy) {
    mProcess->KeepHierarchy(true);
    mProcess->Execute(mScene);

    EXPECT_EQ(5U, mScene->mNumMaterials);
    EXPECT_EQ(49U, mScene->mNumMeshes); // see note on mesh 12 above
}